

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
::find_position<int>
          (sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
           *this,int *key)

{
  size_type sVar1;
  bool bVar2;
  const_reference ppVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  sVar1 = (this->table).settings.table_size;
  uVar5 = (ulong)*key;
  uVar6 = 0xffffffffffffffff;
  lVar7 = 1;
  do {
    uVar5 = uVar5 & sVar1 - 1;
    bVar2 = sparsetable<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
            ::test(&this->table,uVar5);
    if (!bVar2) {
      uVar4 = uVar5;
      if (uVar6 != 0xffffffffffffffff) {
        uVar4 = uVar6;
      }
      uVar5 = 0xffffffffffffffff;
LAB_009c4062:
      pVar8.second = uVar4;
      pVar8.first = uVar5;
      return pVar8;
    }
    bVar2 = test_deleted(this,uVar5);
    if (bVar2) {
      if (uVar6 == 0xffffffffffffffff) {
        uVar6 = uVar5;
      }
    }
    else {
      ppVar3 = sparsetable<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
               ::unsafe_get(&this->table,uVar5);
      if (*key == ppVar3->first) {
        uVar4 = 0xffffffffffffffff;
        goto LAB_009c4062;
      }
    }
    uVar5 = uVar5 + lVar7;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }